

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::draw
          (FunctionalTest *this,bool conditional_or_query_draw,GLenum condition_mode_or_query_target
          )

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  char *pcVar4;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if ((int)CONCAT71(in_register_00000031,conditional_or_query_draw) == 0) {
    (**(code **)(lVar3 + 0x20))(condition_mode_or_query_target);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    pcVar4 = "glBeginQuery() call failed.";
    iVar1 = 0x239;
  }
  else {
    (**(code **)(lVar3 + 0x18))(this->m_qo_id,condition_mode_or_query_target);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    pcVar4 = "glBeginConditionalRender() call failed.";
    iVar1 = 0x234;
  }
  glu::checkError(dVar2,pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,iVar1);
  (**(code **)(lVar3 + 0x538))(5,0,4);
  if (conditional_or_query_draw) {
    (**(code **)(lVar3 + 0x620))();
    dVar2 = (**(code **)(lVar3 + 0x800))();
    pcVar4 = "glEndConditionalRender() call failed.";
    iVar1 = 0x241;
  }
  else {
    (**(code **)(lVar3 + 0x628))(condition_mode_or_query_target);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    pcVar4 = "glEndQuery() call failed.";
    iVar1 = 0x246;
  }
  glu::checkError(dVar2,pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,iVar1);
  return;
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::draw(const bool		   conditional_or_query_draw,
															 const glw::GLenum condition_mode_or_query_target)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (conditional_or_query_draw)
	{
		gl.beginConditionalRender(m_qo_id, condition_mode_or_query_target);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginConditionalRender() call failed.");
	}
	else
	{
		gl.beginQuery(condition_mode_or_query_target, m_qo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery() call failed.");
	}

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

	if (conditional_or_query_draw)
	{
		gl.endConditionalRender();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndConditionalRender() call failed.");
	}
	else
	{
		gl.endQuery(condition_mode_or_query_target);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery() call failed.");
	}
}